

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O3

void __thiscall
pele::physics::turbinflow::TurbInflow::add_turb
          (TurbInflow *this,Box *bx,FArrayBox *data,int dcomp,Geometry *geom,Real time,int dir,
          Side *side)

{
  undefined8 uVar1;
  Box *pBVar2;
  Arena *ar;
  pointer pTVar3;
  int iVar4;
  ulong uVar5;
  pointer pTVar6;
  long lVar7;
  long lVar8;
  pointer pdVar9;
  uint transDir2;
  bool bVar10;
  Vector<double,_std::allocator<double>_> y;
  Vector<double,_std::allocator<double>_> x;
  Box bvalsBox;
  FArrayBox v;
  allocator_type local_109;
  int local_108;
  int local_104;
  TurbInflow *local_100;
  Vector<double,_std::allocator<double>_> local_f8;
  vector<double,_std::allocator<double>_> local_e0;
  Box local_c4;
  undefined8 uStack_a8;
  undefined4 uStack_a0;
  int local_9c [2];
  undefined8 uStack_94;
  FArrayBox *local_88;
  Real local_80;
  BaseFab<double> local_78;
  
  uVar1 = *(undefined8 *)((bx->smallend).vect + 2);
  local_9c[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
  uStack_94 = *(undefined8 *)((bx->bigend).vect + 2);
  uStack_a8 = *(undefined8 *)(bx->smallend).vect;
  uStack_a0 = (undefined4)uVar1;
  local_9c[0] = (int)((ulong)uVar1 >> 0x20);
  lVar7 = (long)dir;
  pBVar2 = (Box *)&(geom->domain).bigend;
  if (*side == low) {
    pBVar2 = &geom->domain;
  }
  local_c4.smallend.vect[2] = (pBVar2->smallend).vect[lVar7] + (uint)(*side != low) * 2 + -1;
  local_88 = data;
  local_80 = time;
  *(int *)((long)&uStack_a8 + lVar7 * 4) = local_c4.smallend.vect[2];
  local_9c[lVar7] = local_c4.smallend.vect[2];
  bVar10 = dir == 0;
  transDir2 = (dir != 2) + 1;
  local_c4.smallend.vect[0] = *(int *)((long)&uStack_a8 + (ulong)((uint)bVar10 * 4));
  local_c4.bigend.vect[0] = *(int *)((long)local_9c + (ulong)((uint)bVar10 * 4));
  uVar5 = (ulong)((uint)(dir != 2) * 4 + 4);
  local_c4.smallend.vect[1] = *(int *)((long)&uStack_a8 + uVar5);
  local_c4.bigend.vect[1] = *(int *)((long)local_9c + uVar5);
  local_c4.btype.itype = 0;
  local_108 = dcomp;
  local_c4.bigend.vect[2] = local_c4.smallend.vect[2];
  ar = amrex::The_Async_Arena();
  amrex::FArrayBox::FArrayBox((FArrayBox *)&local_78,&local_c4,3,ar);
  local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
            (&local_78,(double *)&local_e0,&local_78.domain,(DestComp)0x0,(NumComps)local_78.nvar);
  pTVar3 = (this->tp).
           super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
           .
           super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar6 = (this->tp).
           super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
           .
           super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_100 = this;
  if (pTVar6 != pTVar3 && -1 < (long)pTVar6 - (long)pTVar3) {
    lVar7 = 0;
    local_104 = dir;
    do {
      if ((pTVar3[lVar7].dir == dir) && (pTVar3[lVar7].side == *side)) {
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_e0,(long)((local_c4.bigend.vect[0] - local_c4.smallend.vect[0]) + 1),
                   (allocator_type *)&local_f8);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_f8,
                   (long)((local_c4.bigend.vect[1] - local_c4.smallend.vect[1]) + 1),&local_109);
        dir = local_104;
        pTVar3 = (local_100->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_c4.smallend.vect[0] <= local_c4.bigend.vect[0]) {
          pdVar9 = local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = local_c4.smallend.vect[0];
          do {
            *pdVar9 = (((double)iVar4 + 0.5) * (geom->super_CoordSys).dx[bVar10] +
                      (geom->prob_domain).xlo[bVar10]) * *(Real *)((long)(pTVar3 + lVar7) + 200);
            pdVar9 = pdVar9 + 1;
            iVar4 = iVar4 + 1;
          } while (local_c4.bigend.vect[0] + 1 != iVar4);
        }
        if (local_c4.smallend.vect[1] <= local_c4.bigend.vect[1]) {
          pdVar9 = local_f8.super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = local_c4.smallend.vect[1];
          do {
            *pdVar9 = (((double)iVar4 + 0.5) * (geom->super_CoordSys).dx[transDir2] +
                      (geom->prob_domain).xlo[transDir2]) * *(Real *)((long)(pTVar3 + lVar7) + 200);
            pdVar9 = pdVar9 + 1;
            iVar4 = iVar4 + 1;
          } while (local_c4.bigend.vect[1] + 1 != iVar4);
        }
        fill_turb_plane(pTVar3 + lVar7,(Vector<double,_std::allocator<double>_> *)&local_e0,
                        &local_f8,
                        (*(Real *)((long)(pTVar3 + lVar7) + 0x98) + local_80) *
                        *(Real *)((long)(pTVar3 + lVar7) + 0xd8) *
                        *(Real *)((long)(pTVar3 + lVar7) + 200),(FArrayBox *)&local_78);
        if (local_f8.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start != (double *)0x0) {
          operator_delete(local_f8.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f8.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        pTVar3 = (local_100->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pTVar6 = (local_100->tp).
                 super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 .
                 super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar7 = lVar7 + 1;
      lVar8 = ((long)pTVar6 - (long)pTVar3 >> 4) * -0xf0f0f0f0f0f0f0f;
    } while (lVar8 - lVar7 != 0 && lVar7 <= lVar8);
  }
  set_turb(dir,(uint)(dir == 0),transDir2,(FArrayBox *)&local_78,local_88,local_108);
  local_78._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  amrex::BaseFab<double>::clear(&local_78);
  return;
}

Assistant:

void
TurbInflow::add_turb(
  amrex::Box const& bx,
  amrex::FArrayBox& data,
  const int dcomp,
  amrex::Geometry const& geom,
  const amrex::Real time,
  const int dir,
  const amrex::Orientation::Side& side)
{
  AMREX_ASSERT(turbinflow_initialized);

  // Box on which we will access data
  amrex::Box bvalsBox = bx;
  int planeLoc =
    (side == amrex::Orientation::low ? geom.Domain().smallEnd()[dir] - 1
                                     : geom.Domain().bigEnd()[dir] + 1);
  bvalsBox.setSmall(dir, planeLoc);
  bvalsBox.setBig(dir, planeLoc);

  // Define box that we will fill with turb: need to be z-normal
  // Get transverse directions
  int tdir1 = (dir != 0) ? 0 : 1;
  int tdir2 = (dir != 0) ? ((dir == 2) ? 1 : 2) : 2;
  int tr1Lo = bvalsBox.smallEnd()[tdir1];
  int tr1Hi = bvalsBox.bigEnd()[tdir1];
  int tr2Lo = bvalsBox.smallEnd()[tdir2];
  int tr2Hi = bvalsBox.bigEnd()[tdir2];
  const amrex::IntVect lo(AMREX_D_DECL(tr1Lo, tr2Lo, planeLoc));
  const amrex::IntVect hi(AMREX_D_DECL(tr1Hi, tr2Hi, planeLoc));
  amrex::Box turbBox(lo, hi);
  amrex::FArrayBox v(turbBox, 3, amrex::The_Async_Arena());
  v.setVal<amrex::RunOn::Device>(0);

  // Add turbulence from all the tp acting on this face
  for (int n = 0; n < tp.size(); n++) {

    if (tp[n].dir == dir && tp[n].side == side) {

      // 0 and 1 are the two transverse directions
      amrex::Vector<amrex::Real> x(turbBox.size()[0]), y(turbBox.size()[1]);
      for (int i = turbBox.smallEnd()[0]; i <= turbBox.bigEnd()[0]; ++i) {
        x[i - turbBox.smallEnd()[0]] =
          (geom.ProbLo()[tdir1] + (i + 0.5) * geom.CellSize(tdir1)) *
          tp[n].turb_scale_loc;
      }
      for (int j = turbBox.smallEnd()[1]; j <= turbBox.bigEnd()[1]; ++j) {
        y[j - turbBox.smallEnd()[1]] =
          (geom.ProbLo()[tdir2] + (j + 0.5) * geom.CellSize(tdir2)) *
          tp[n].turb_scale_loc;
      }

      // Get the turbulence
      amrex::Real z =
        (time + tp[n].time_shift) * tp[n].turb_conv_vel * tp[n].turb_scale_loc;
      fill_turb_plane(tp[n], x, y, z, v);
    }
  }

  // Moving it into data
  set_turb(dir, tdir1, tdir2, v, data, dcomp);

#if 0
  std::string junk = "TurbV_AftTP"+std::to_string(n)+"_D";
  std::ofstream os;
  os.precision(15);
  os.open(junk.c_str());
  data.writeOn(os);
  os.close();
  amrex::Abort();
#endif
}